

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O3

char * show_token_sequence(dmr_C *C,token *token,int quote)

{
  char *pcVar1;
  char *__s;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  
  if (token == (token *)0x0 && quote == 0) {
    pcVar3 = "<none>";
  }
  else {
    pcVar3 = C->preprocessor_buffer;
    pcVar1 = pcVar3;
    if (token != &dmrC_eof_token_entry_) {
      lVar4 = 0x122c;
      uVar5 = 0;
      do {
        if (quote == 0) {
          __s = dmrC_show_token(C,token);
        }
        else {
          __s = dmrC_quote_token(C,token);
        }
        sVar2 = strlen(__s);
        sVar2 = (size_t)(int)sVar2;
        if (0x322a < (long)(uVar5 + lVar4 + sVar2)) {
          dmrC_sparse_error(C,token->pos,"too long token expansion");
          pcVar1 = (char *)((long)&C->target + lVar4);
          break;
        }
        if ((int)uVar5 != 0) {
          lVar4 = lVar4 + 1;
          *pcVar1 = ' ';
        }
        memcpy((void *)((long)&C->target + lVar4),__s,sVar2);
        lVar4 = lVar4 + sVar2;
        token = token->next;
        uVar5 = (ulong)(*(uint *)&token->pos >> 0x15 & 1);
        pcVar1 = (char *)((long)&C->target + lVar4);
      } while (token != &dmrC_eof_token_entry_);
    }
    *pcVar1 = '\0';
  }
  return pcVar3;
}

Assistant:

static const char *show_token_sequence(struct dmr_C *C, struct token *token, int quote)
{
	char *ptr = C->preprocessor_buffer;
	int whitespace = 0;

	if (!token && !quote)
		return "<none>";
	while (!dmrC_eof_token(token)) {
		const char *val = quote ? dmrC_quote_token(C, token) : dmrC_show_token(C, token);
		int len = (int) strlen(val);

		if (ptr + whitespace + len >= C->preprocessor_buffer + sizeof C->preprocessor_buffer) {
			dmrC_sparse_error(C, token->pos, "too long token expansion");
			break;
		}

		if (whitespace)
			*ptr++ = ' ';
		memcpy(ptr, val, len);
		ptr += len;
		token = token->next;
		whitespace = token->pos.whitespace;
	}
	*ptr = 0;
	return C->preprocessor_buffer;
}